

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeriesInteractionType.hpp
# Opt level: O0

void __thiscall
OpenMD::InversePowerSeriesInteractionType::~InversePowerSeriesInteractionType
          (InversePowerSeriesInteractionType *this)

{
  undefined8 *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  *in_RDI = &PTR__InversePowerSeriesInteractionType_00483b78;
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  NonBondedInteractionType::~NonBondedInteractionType((NonBondedInteractionType *)0x27cbc2);
  return;
}

Assistant:

InversePowerSeriesInteractionType(
        std::vector<std::pair<int, RealType>> series) {
      powers.clear();
      coefficients.clear();

      std::vector<std::pair<int, RealType>>::iterator it;

      for (it = series.begin(); it != series.end(); ++it) {
        powers.push_back((*it).first);
        coefficients.push_back((*it).second);
      }

      setInversePowerSeries();
    }